

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_sub_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  size_t sVar2;
  mbedtls_mpi_uint **ppmVar3;
  size_t *psVar4;
  mbedtls_mpi TB;
  mbedtls_mpi local_48;
  
  iVar1 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar1 < 0) {
    return -10;
  }
  psVar4 = &local_48.n;
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  if (X == B) {
    iVar1 = mbedtls_mpi_copy(&local_48,B);
    if (iVar1 != 0) goto LAB_00117f6b;
    ppmVar3 = &local_48.p;
  }
  else {
    ppmVar3 = &B->p;
    psVar4 = &B->n;
  }
  if ((X == A) || (iVar1 = mbedtls_mpi_copy(X,A), iVar1 == 0)) {
    X->s = 1;
    sVar2 = *psVar4;
    if (sVar2 != 0) {
      do {
        if ((*ppmVar3)[sVar2 - 1] != 0) goto LAB_00117f42;
        sVar2 = sVar2 - 1;
      } while (sVar2 != 0);
      sVar2 = 0;
    }
LAB_00117f42:
    mpi_sub_hlp(sVar2,*ppmVar3,X->p);
    iVar1 = 0;
  }
LAB_00117f6b:
  if (local_48.p != (mbedtls_mpi_uint *)0x0) {
    if (local_48.n != 0) {
      sVar2 = 0;
      do {
        local_48.p[sVar2] = 0;
        sVar2 = sVar2 + 1;
      } while (local_48.n != sVar2);
    }
    free(local_48.p);
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_sub_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    mbedtls_mpi TB;
    int ret;
    size_t n;

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
        return( MBEDTLS_ERR_MPI_NEGATIVE_VALUE );

    mbedtls_mpi_init( &TB );

    if( X == B )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) );
        B = &TB;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned subtractions.
     */
    X->s = 1;

    ret = 0;

    for( n = B->n; n > 0; n-- )
        if( B->p[n - 1] != 0 )
            break;

    mpi_sub_hlp( n, B->p, X->p );

cleanup:

    mbedtls_mpi_free( &TB );

    return( ret );
}